

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O1

void __thiscall
libDAI::HAK::findLoopClusters
          (HAK *this,FactorGraph *fg,
          set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_> *allcl,
          VarSet *newcl,Var *root,size_t length,VarSet *vars)

{
  pointer pVVar1;
  pointer pVVar2;
  Var *n;
  ulong uVar3;
  bool bVar4;
  VarSet ind;
  VarSet local_100;
  size_t local_e0;
  HAK *local_d8;
  VarSet local_d0;
  VarSet local_b0;
  VarSet local_90;
  VarSet local_70;
  VarSet local_50;
  
  n = (vars->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start;
  if (n != (vars->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    local_e0 = length - 1;
    local_d8 = this;
    do {
      (*(fg->super_GraphicalModel)._vptr_GraphicalModel[0xe])(&local_d0,fg,n);
      uVar3 = (long)(newcl->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(newcl->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (uVar3 < 0x11) {
LAB_004adcb0:
        bVar4 = false;
      }
      else {
        VarSet::VarSet(&local_50,root);
        pVVar2 = local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar1 = local_d0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_finish &&
            local_d0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_d0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            if (pVVar2->_label < pVVar1->_label) goto LAB_004adcb0;
            pVVar2 = pVVar2 + (pVVar2->_label <= pVVar1->_label);
          } while ((pVVar1 + 1 !=
                    local_d0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                    _M_impl.super__Vector_impl_data._M_finish) &&
                  (pVVar1 = pVVar1 + 1,
                  pVVar2 != local_50._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_finish));
        }
        bVar4 = pVVar2 == local_50._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_finish;
      }
      if ((0x10 < uVar3) &&
         (local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_50._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_50._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (bVar4) {
        VarSet::VarSet(&local_70,n);
        VarSet::operator|(&local_100,newcl,&local_70);
        std::
        _Rb_tree<libDAI::VarSet,_libDAI::VarSet,_std::_Identity<libDAI::VarSet>,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_>
        ::_M_insert_unique<libDAI::VarSet>(&allcl->_M_t,&local_100);
        pVVar1 = local_70._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar2 = local_70._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (local_100._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_100._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_100._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_100._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          pVVar1 = local_70._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pVVar2 = local_70._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
joined_r0x004adddc:
        if (pVVar1 != (pointer)0x0) {
          operator_delete(pVVar1,(long)pVVar2 - (long)pVVar1);
        }
      }
      else if (1 < length) {
        VarSet::VarSet(&local_100,n);
        VarSet::operator|(&local_b0,newcl,&local_100);
        VarSet::operator/(&local_90,&local_d0,newcl);
        findLoopClusters(local_d8,fg,allcl,&local_b0,root,local_e0,&local_90);
        if (local_90._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_90._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_90._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pVVar1 = local_100._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar2 = local_100._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (local_b0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b0._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_b0._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b0._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          pVVar1 = local_100._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pVVar2 = local_100._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        goto joined_r0x004adddc;
      }
      if (local_d0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_d0._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      n = n + 1;
    } while (n != (vars->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void HAK::findLoopClusters( const FactorGraph & fg, std::set<VarSet> &allcl, VarSet newcl, const Var & root, size_t length, VarSet vars ) {
        for( VarSet::const_iterator in = vars.begin(); in != vars.end(); in++ ) {
            VarSet ind = fg.delta( *in );
            if( (newcl.size()) >= 2 && (ind >> root) ) {
                allcl.insert( newcl | *in );
            }
            else if( length > 1 )
                findLoopClusters( fg, allcl, newcl | *in, root, length - 1, ind / newcl );
        }
    }